

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

bool __thiscall
MT32Emu::Synth::initTimbres
          (Synth *this,Bit16u mapAddress,Bit16u offset,Bit16u count,Bit16u startTimbre,
          bool compressed)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  undefined6 in_register_0000000a;
  ushort uVar4;
  undefined6 in_register_00000032;
  ulong uVar5;
  uint uVar6;
  bool local_59;
  uint local_40;
  
  iVar3 = (int)CONCAT62(in_register_0000000a,count);
  local_59 = iVar3 == 0;
  if (!local_59) {
    uVar1 = iVar3 * 2;
    uVar5 = 0;
    uVar4 = 0;
    do {
      local_40 = (uint)offset;
      if ((compressed) ||
         (local_40 +
          *(ushort *)
           (this->controlROMData +
           (ulong)uVar4 + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff)) < 0xff0b)) {
        uVar6 = *(ushort *)
                 (this->controlROMData +
                 (ulong)uVar4 + (CONCAT62(in_register_00000032,mapAddress) & 0xffffffff)) + local_40
                & 0xffff;
        if (compressed) {
          bVar2 = initCompressedTimbre
                            (this,startTimbre,this->controlROMData + uVar6,0x10000 - uVar6);
          if (!bVar2) {
            bVar2 = false;
            printDebug(this,
                       "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x"
                       ,uVar5,(ulong)startTimbre,(ulong)uVar6);
            goto LAB_001138c2;
          }
        }
        else {
          MemoryRegion::write(&this->timbresMemoryRegion->super_MemoryRegion,(uint)startTimbre,
                              (void *)0x0,(size_t)(this->controlROMData + uVar6));
        }
        startTimbre = startTimbre + 1;
        bVar2 = true;
      }
      else {
        bVar2 = false;
        printDebug(this,
                   "Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x"
                   ,uVar5,(ulong)startTimbre);
      }
LAB_001138c2:
      if (!bVar2) {
        return local_59;
      }
      uVar4 = uVar4 + 2;
      uVar5 = (ulong)uVar4;
      local_59 = uVar1 <= uVar4;
    } while (uVar4 < uVar1);
  }
  return local_59;
}

Assistant:

bool Synth::initTimbres(Bit16u mapAddress, Bit16u offset, Bit16u count, Bit16u startTimbre, bool compressed) {
	const Bit8u *timbreMap = &controlROMData[mapAddress];
	for (Bit16u i = 0; i < count * 2; i += 2) {
		Bit16u address = (timbreMap[i + 1] << 8) | timbreMap[i];
		if (!compressed && (address + offset + sizeof(TimbreParam) > CONTROL_ROM_SIZE)) {
			printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre address 0x%04x", i, startTimbre, address);
			return false;
		}
		address += offset;
		if (compressed) {
			if (!initCompressedTimbre(startTimbre, &controlROMData[address], CONTROL_ROM_SIZE - address)) {
				printDebug("Control ROM error: Timbre map entry 0x%04x for timbre %d points to invalid timbre at 0x%04x", i, startTimbre, address);
				return false;
			}
		} else {
			timbresMemoryRegion->write(startTimbre, 0, &controlROMData[address], sizeof(TimbreParam), true);
		}
		startTimbre++;
	}
	return true;
}